

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

SPIRType * __thiscall
diligent_spirv_cross::Compiler::set<diligent_spirv_cross::SPIRType,spv::Op>
          (Compiler *this,uint32_t id,Op *args)

{
  Variant *var_00;
  TypedID<(diligent_spirv_cross::Types)0> local_34;
  SPIRType *local_30;
  SPIRType *var;
  Op *local_20;
  Op *args_local;
  Compiler *pCStack_10;
  uint32_t id_local;
  Compiler *this_local;
  
  local_20 = args;
  args_local._4_4_ = id;
  pCStack_10 = this;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeType,var._4_4_);
  var_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,
                      (ulong)args_local._4_4_);
  local_30 = variant_set<diligent_spirv_cross::SPIRType,spv::Op>(var_00,local_20);
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_34,args_local._4_4_);
  (local_30->super_IVariant).self.id = local_34.id;
  set_initializers<diligent_spirv_cross::SPIRType>(this,local_30);
  return local_30;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}